

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

int32_t testing::internal::Int32FromGTestEnv(char *flag,int32_t default_value)

{
  bool bVar1;
  char *name;
  Message *pMVar2;
  undefined8 uVar3;
  char *in_RDX;
  Message local_90;
  string local_88;
  Message local_68;
  int32_t local_5c [2];
  int32_t result;
  char *local_48;
  char *string_value;
  string env_var;
  int32_t default_value_local;
  char *flag_local;
  
  env_var.field_2._12_4_ = default_value;
  FlagToEnvVar_abi_cxx11_((string *)&string_value,(internal *)flag,in_RDX);
  name = (char *)std::__cxx11::string::c_str();
  local_48 = posix::GetEnv(name);
  if (local_48 == (char *)0x0) {
    flag_local._4_4_ = env_var.field_2._12_4_;
  }
  else {
    local_5c[0] = env_var.field_2._12_4_;
    Message::Message(&local_68);
    pMVar2 = Message::operator<<(&local_68,(char (*) [22])"Environment variable ");
    pMVar2 = Message::operator<<(pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&string_value);
    bVar1 = ParseInt32(pMVar2,local_48,local_5c);
    Message::~Message(&local_68);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      flag_local._4_4_ = local_5c[0];
    }
    else {
      Message::Message(&local_90);
      pMVar2 = Message::operator<<(&local_90,(int *)(env_var.field_2._M_local_buf + 0xc));
      Message::GetString_abi_cxx11_(&local_88,pMVar2);
      uVar3 = std::__cxx11::string::c_str();
      printf("The default value %s is used.\n",uVar3);
      std::__cxx11::string::~string((string *)&local_88);
      Message::~Message(&local_90);
      fflush(_stdout);
      flag_local._4_4_ = env_var.field_2._12_4_;
    }
  }
  local_5c[1] = 1;
  std::__cxx11::string::~string((string *)&string_value);
  return flag_local._4_4_;
}

Assistant:

int32_t Int32FromGTestEnv(const char* flag, int32_t default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var, string_value,
                  &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}